

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

int __thiscall Engine::init(Engine *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ulong uVar2;
  char *ctx_00;
  IntVar *pIVar3;
  uint i_1;
  uint i;
  ulong uVar4;
  
  ctx_00 = (char *)ctx;
  for (uVar4 = 0; uVar2 = (ulong)(this->vars).sz, uVar4 < uVar2; uVar4 = uVar4 + 1) {
    pIVar3 = (this->vars).data[uVar4];
    if ((pIVar3->pinfo).sz == 0) {
      pIVar3->in_queue = true;
    }
    else {
      IntVar::pushInQueue(pIVar3);
    }
  }
  if (so.lazy == false) {
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      ctx_00 = (char *)0x1;
      IntVar::initVals((this->vars).data[uVar4],true);
      uVar2 = (ulong)(this->vars).sz;
    }
  }
  else {
    for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      pIVar3 = (this->vars).data[uVar4];
      if (so.eager_limit < (pIVar3->max).v - (pIVar3->min).v) {
        if (1 < so.verbosity) {
          ctx_00 = "using lazy literal\n";
          std::operator<<((ostream *)&std::cerr,"using lazy literal\n");
          pIVar3 = (this->vars).data[uVar4];
        }
        IntVar::specialiseToLL(pIVar3);
      }
      else {
        IntVar::specialiseToEL(pIVar3);
      }
      uVar2 = (ulong)(this->vars).sz;
    }
  }
  process_ircs();
  wf_init();
  if (so.mip == true) {
    MIP::init(mip,(EVP_PKEY_CTX *)ctx_00);
  }
  SAT::init(&sat,(EVP_PKEY_CTX *)ctx_00);
  iVar1 = (*this->problem->_vptr_Problem[1])();
  if (so.ldsb == true) {
    iVar1 = LDSB::init(&ldsb,(EVP_PKEY_CTX *)ctx_00);
  }
  this->finished_init = true;
  return iVar1;
}

Assistant:

void Engine::init() {
	// Get the vars ready
	for (unsigned int i = 0; i < vars.size(); i++) {
		IntVar* v = vars[i];
		if (v->pinfo.size() == 0) {
			v->in_queue = true;
		} else {
			v->pushInQueue();
		}
	}

	if (so.lazy) {
		for (unsigned int i = 0; i < vars.size(); i++) {
			if (vars[i]->getMax() - vars[i]->getMin() <= so.eager_limit) {
				vars[i]->specialiseToEL();
			} else {
				if (so.verbosity >= 2) {
					std::cerr << "using lazy literal\n";
				}
				vars[i]->specialiseToLL();
			}
		}
	} else {
		for (unsigned int i = 0; i < vars.size(); i++) {
			vars[i]->initVals(true);
		}
	}

	// Get the propagators ready

	process_ircs();

	// Get well founded propagators ready

	wf_init();

	// Get MIP propagator ready

	if (so.mip) {
		mip->init();
	}

	// Get SAT propagator ready

	sat.init();

	// Set lits allowed to be in learnt clauses
	problem->restrict_learnable();

	// Get LDSB ready

	if (so.ldsb) {
		ldsb.init();
	}

	// Do MIP presolve

	if (so.mip) {
		mip->presolve();
	}

	// Ready

	finished_init = true;
}